

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

LoadInst * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::LoadInst,LLVMBC::Type*&,LLVMBC::Value*&>
          (LLVMContext *this,Type **u,Value **u_1)

{
  LoadInst *this_00;
  LoadInst *t;
  LoadInst *mem;
  Value **u_local_1;
  Type **u_local;
  LLVMContext *this_local;
  
  this_00 = (LoadInst *)allocate(this,0x70,8);
  if (this_00 == (LoadInst *)0x0) {
    std::terminate();
  }
  LoadInst::LoadInst(this_00,*u,*u_1);
  append_typed_destructor<LLVMBC::LoadInst>(this,this_00);
  return this_00;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}